

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_uint64(char **pBuf,uint64 *value)

{
  int iVar1;
  bool bVar2;
  uint c;
  uint64 result2;
  uint64 result8;
  uint64 result;
  char *p;
  uint64 *value_local;
  char **pBuf_local;
  
  *value = 0;
  result = (uint64)*pBuf;
  while( true ) {
    bVar2 = false;
    if (*(char *)result != '\0') {
      iVar1 = isspace((int)*(char *)result);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    result = result + 1;
  }
  result8 = 0;
  iVar1 = isdigit((int)*(char *)result);
  if (iVar1 != 0) {
    while( true ) {
      bVar2 = false;
      if (*(char *)result != '\0') {
        iVar1 = isdigit((int)*(char *)result);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        *value = result8;
        *pBuf = (char *)result;
        return true;
      }
      if ((result8 & 0xe000000000000000) != 0) {
        return false;
      }
      if (result8 * -8 - 1 < result8 * 2) {
        return false;
      }
      if (result8 * -10 - 1 < (ulong)((int)*(char *)result - 0x30U)) break;
      result8 = (ulong)((int)*(char *)result - 0x30U) + result8 * 10;
      result = result + 1;
    }
  }
  return false;
}

Assistant:

bool string_to_uint64(const char*& pBuf, uint64& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint64 result = 0;

        if (!isdigit(*p))
        {
            return false;
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE000000000000000ULL)
            {
                return false;
            }

            const uint64 result8 = result << 3U;
            const uint64 result2 = result << 1U;

            if (result2 > (0xFFFFFFFFFFFFFFFFULL - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFFFFFFFFFULL - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        value = result;

        pBuf = p;

        return true;
    }